

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_PrintStats(Fx_Man_t *p,abctime clk)

{
  uint uVar1;
  abctime time;
  char *pStr;
  
  uVar1 = Vec_WecSizeUsed(p->vCubes);
  printf("Cubes =%8d  ",(ulong)uVar1);
  uVar1 = Vec_WecSizeUsed(p->vLits);
  printf("Lits  =%8d  ",(ulong)uVar1);
  printf("Divs  =%8d  ",(ulong)(uint)p->pHash->vMap->nSize);
  uVar1 = Vec_QueSize(p->vPrio);
  printf("Divs+ =%8d  ",(ulong)uVar1);
  printf("Compl =%8d  ",(ulong)(uint)p->nDivMux[1]);
  pStr = (char *)(ulong)(uint)p->nDivs;
  printf("Extr  =%7d  ");
  Abc_PrintTime((int)clk,pStr,time);
  return;
}

Assistant:

static void Fx_PrintStats( Fx_Man_t * p, abctime clk )
{
    printf( "Cubes =%8d  ", Vec_WecSizeUsed(p->vCubes) );
    printf( "Lits  =%8d  ", Vec_WecSizeUsed(p->vLits) );
    printf( "Divs  =%8d  ", Hsh_VecSize(p->pHash) );
    printf( "Divs+ =%8d  ", Vec_QueSize(p->vPrio) );
    printf( "Compl =%8d  ", p->nDivMux[1] );
    printf( "Extr  =%7d  ", p->nDivs );
//    printf( "DivsS =%6d  ", p->nDivsS );
//    printf( "PairS =%6d  ", p->nPairsS );
//    printf( "PairD =%6d  ", p->nPairsD );
    Abc_PrintTime( 1, "Time", clk );
//    printf( "\n" );
}